

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing-utils.c
# Opt level: O1

_Bool str_to_int32(char *string,int32_t *out)

{
  char cVar1;
  size_t sVar2;
  int *piVar3;
  long lVar4;
  _Bool _Var5;
  int32_t iVar6;
  long lVar7;
  int __base;
  char *endptr;
  char *local_38;
  
  sVar2 = strlen(string);
  lVar7 = 1;
  if (sVar2 == 0) {
    sVar2 = 0;
  }
  else {
    cVar1 = *string;
    if ((cVar1 == '-') || (cVar1 == '+')) {
      sVar2 = sVar2 - 1;
      string = string + 1;
      lVar7 = (ulong)(cVar1 != '-') * 2 + -1;
    }
  }
  __base = 10;
  if (sVar2 < 2) goto LAB_00103ca7;
  if (*string == '0') {
    if (string[1] == 'x') {
      string = string + 2;
      sVar2 = sVar2 - 2;
      __base = 0x10;
      goto LAB_00103ca7;
    }
    if (string[1] == 'b') {
      string = string + 2;
      sVar2 = sVar2 - 2;
      __base = 2;
      goto LAB_00103ca7;
    }
  }
  sVar2 = 1;
LAB_00103ca7:
  local_38 = (char *)0x0;
  piVar3 = __errno_location();
  *piVar3 = 0;
  lVar4 = strtol(string,&local_38,__base);
  _Var5 = false;
  if (((sVar2 != 0) && (_Var5 = false, *piVar3 != 0x22)) &&
     (_Var5 = false, 0xfffffffeffffffff < lVar4 * lVar7 - 0x80000000U)) {
    if (local_38 == (char *)0x0 || local_38 == string) {
      _Var5 = false;
    }
    else {
      _Var5 = *local_38 == '\0';
    }
  }
  iVar6 = -0x80000000;
  if (_Var5 != false) {
    iVar6 = (int32_t)(lVar4 * lVar7);
  }
  *out = iVar6;
  return _Var5;
}

Assistant:

bool str_to_int32(const char *string, int32_t *out) {
    size_t len = strlen(string);
    int base = 10;

    bool is_negated = false;
    if (len >= 1 && (string[0] == '-' || string[0] == '+')) {
        is_negated = string[0] == '-';

        len -= 1;
        string += 1;
    }

    if (len >= 2 && string[0] == '0' && string[1] == 'x') {
        base = 16;
        string += 2;
        len -= 2;
    } else if (len >= 2 && string[0] == '0' && string[1] == 'b') {
        base = 2;
        string += 2;
        len -= 2;
    }

    STATIC_ASSERT(sizeof(long) >= sizeof(int32_t),
                  "These sizes should match so that we can use the correct "
                  "strtoXXX C function");

    char *endptr = NULL;
    errno = 0;
    long conv_ret_val = strtol(string, &endptr, base);
    conv_ret_val *= is_negated ? -1 : +1;

    bool out_of_range = (errno == ERANGE) || (conv_ret_val < INT32_MIN) ||
                        (conv_ret_val > INT32_MAX);

    bool failed =
        len == 0 || out_of_range || endptr == string || endptr == NULL;
    bool result = !failed && *endptr == '\0';

    if (result) {
        *out = conv_ret_val;
    } else {
        *out = INT32_MIN;
    }

    return result;
}